

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O2

void __thiscall wasm::LocalGraphFlower::flow(LocalGraphFlower *this)

{
  pointer pvVar1;
  Id IVar2;
  pointer pFVar3;
  pointer ppLVar4;
  undefined1 auVar5 [8];
  LocalSet *pLVar6;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *pSVar7;
  vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *gets;
  pointer ppLVar8;
  uint uVar9;
  pointer pFVar10;
  ulong uVar11;
  reference rVar12;
  undefined1 local_88 [8];
  vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
  allGets;
  LocalGet *get_1;
  value_type *__range6;
  LocalSet *local_50;
  LocalSet *set;
  pointer local_40;
  LocalSet *local_38;
  LocalGet *get;
  
  prepareFlowBlocks(this);
  set = (LocalSet *)Function::getNumLocals(this->func);
  pFVar3 = (this->flowBlocks).
           super__Vector_base<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar10 = (this->flowBlocks).
            super__Vector_base<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (pFVar10 != pFVar3) {
    std::
    vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
    ::vector((vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
              *)local_88,(size_type)set,(allocator_type *)&local_38);
    uVar11 = (ulong)((long)(pFVar10->actions).
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pFVar10->actions).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
    local_40 = pFVar10;
    while (0 < (int)uVar11) {
      uVar11 = uVar11 - 1;
      pLVar6 = (LocalSet *)
               (local_40->actions).
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11];
      IVar2 = (((SpecificExpression<(wasm::Expression::Id)8> *)
               &pLVar6->super_SpecificExpression<(wasm::Expression::Id)9>)->super_Expression)._id;
      local_38 = (LocalSet *)0x0;
      if (IVar2 == LocalGetId) {
        local_38 = pLVar6;
      }
      if (local_38 == (LocalSet *)0x0) {
        if (IVar2 != LocalSetId) {
          pLVar6 = (LocalSet *)0x0;
        }
        local_50 = pLVar6;
        if (pLVar6 != (LocalSet *)0x0) {
          uVar9 = pLVar6->index;
          pvVar1 = (pointer)((long)local_88 + (ulong)uVar9 * 0x18);
          ppLVar4 = (((pointer)((long)local_88 + (ulong)uVar9 * 0x18))->
                    super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>)._M_impl
                    .super__Vector_impl_data._M_finish;
          for (ppLVar8 = (((pointer)((long)local_88 + (ulong)uVar9 * 0x18))->
                         super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>).
                         _M_impl.super__Vector_impl_data._M_start; ppLVar8 != ppLVar4;
              ppLVar8 = ppLVar8 + 1) {
            allGets.
            super__Vector_base<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppLVar8;
            pSVar7 = &std::__detail::
                      _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this->getSetsMap,
                                   (key_type *)
                                   &allGets.
                                    super__Vector_base<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                      super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
            ;
            SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
            ::insert(pSVar7,&local_50);
          }
          ppLVar8 = (pvVar1->super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((pvVar1->super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>).
              _M_impl.super__Vector_impl_data._M_finish != ppLVar8) {
            (pvVar1->super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>).
            _M_impl.super__Vector_impl_data._M_finish = ppLVar8;
          }
        }
      }
      else {
        std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::push_back
                  ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)
                   ((long)local_88 + (ulong)local_38->index * 0x18),(value_type *)&local_38);
      }
    }
    for (uVar9 = 0; auVar5 = local_88, pLVar6 = (LocalSet *)(ulong)uVar9, pLVar6 < set;
        uVar9 = uVar9 + 1) {
      if ((((pointer)((long)local_88 + pLVar6 * 0x18))->
          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>)._M_impl.
          super__Vector_impl_data._M_start !=
          (((pointer)((long)local_88 + pLVar6 * 0x18))->
          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->hasSet,(size_type)pLVar6);
        gets = (vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)
               ((long)auVar5 + pLVar6 * 0x18);
        if ((*rVar12._M_p & rVar12._M_mask) == 0) {
          ppLVar4 = (gets->super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppLVar8 = (gets->
                         super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>).
                         _M_impl.super__Vector_impl_data._M_start; ppLVar8 != ppLVar4;
              ppLVar8 = ppLVar8 + 1) {
            local_38 = (LocalSet *)*ppLVar8;
            pSVar7 = &std::__detail::
                      _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this->getSetsMap,(key_type *)&local_38)->
                      super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
            ;
            local_50 = (LocalSet *)0x0;
            SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
            ::insert(pSVar7,&local_50);
          }
        }
        else {
          flowBackFromStartOfBlock(this,local_40,uVar9,gets);
        }
      }
    }
    std::
    vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
    ::~vector((vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
               *)local_88);
    pFVar10 = local_40 + 1;
  }
  return;
}

Assistant:

void flow() {
    prepareFlowBlocks();

    auto numLocals = func->getNumLocals();

    for (auto& block : flowBlocks) {
#ifdef LOCAL_GRAPH_DEBUG
      std::cout << "basic block " << &block << " :\n";
      for (auto& action : block.actions) {
        std::cout << "  action: " << *action << '\n';
      }
      for (auto& val : block.lastSets) {
        std::cout << "  last set " << val.second << '\n';
      }
#endif

      // Track all gets in this block, by index.
      std::vector<std::vector<LocalGet*>> allGets(numLocals);

      // go through the block, finding each get and adding it to its index,
      // and seeing how sets affect that
      auto& actions = block.actions;

      // move towards the front, handling things as we go
      for (int i = int(actions.size()) - 1; i >= 0; i--) {
        auto* action = actions[i];
        if (auto* get = action->dynCast<LocalGet>()) {
          allGets[get->index].push_back(get);
        } else if (auto* set = action->dynCast<LocalSet>()) {
          // This set is the only set for all those gets.
          auto& gets = allGets[set->index];
          for (auto* get : gets) {
            getSetsMap[get].insert(set);
          }
          gets.clear();
        }
      }
      // If anything is left, we must flow it back through other blocks. we
      // can do that for all gets as a whole, they will get the same results.
      for (Index index = 0; index < numLocals; index++) {
        auto& gets = allGets[index];
        if (gets.empty()) {
          continue;
        }
        if (!hasSet[index]) {
          // This local index has no sets, so we know all gets will end up
          // reaching the entry block. Do that here as an optimization to avoid
          // flowing through the (potentially very many) blocks in the function.
          //
          // Note that we may be in unreachable code, and if so, we might add
          // the entry values when they are not actually relevant. That is, we
          // are not precise in the case of unreachable code. This can be
          // confusing when debugging, but it does not have any downside for
          // optimization (since unreachable code should be removed anyhow).
          for (auto* get : gets) {
            getSetsMap[get].insert(nullptr);
          }
          continue;
        }

        flowBackFromStartOfBlock(&block, index, gets);
      }
    }
  }